

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# textures.cpp
# Opt level: O3

SpectrumMixTexture *
pbrt::SpectrumMixTexture::Create
          (Transform *renderFromTexture,TextureParameterDictionary *parameters,
          SpectrumType spectrumType,FileLoc *loc,Allocator alloc)

{
  int iVar1;
  int iVar2;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  SpectrumMixTexture *pSVar3;
  Allocator alloc_00;
  Allocator alloc_01;
  undefined1 local_b8 [16];
  long *local_a8 [2];
  long local_98 [2];
  undefined1 local_88 [8];
  long *local_80;
  long local_70 [2];
  TaggedPointer<pbrt::ConstantSpectrum,_pbrt::DenselySampledSpectrum,_pbrt::PiecewiseLinearSpectrum,_pbrt::RGBAlbedoSpectrum,_pbrt::RGBUnboundedSpectrum,_pbrt::RGBIlluminantSpectrum,_pbrt::BlackbodySpectrum>
  local_60 [2];
  _Base_ptr local_50 [2];
  ulong local_40;
  ulong local_38;
  undefined4 extraout_var_01;
  
  iVar1 = (*(alloc.memoryResource)->_vptr_memory_resource[2])(alloc.memoryResource,4,4);
  *(undefined4 *)CONCAT44(extraout_var,iVar1) = 0;
  iVar2 = (*(alloc.memoryResource)->_vptr_memory_resource[2])(alloc.memoryResource,4,4);
  local_a8[0] = local_98;
  *(undefined4 *)CONCAT44(extraout_var_00,iVar2) = 0x3f800000;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_a8,"tex1","");
  alloc_00.memoryResource._4_4_ = 0;
  alloc_00.memoryResource._0_4_ = spectrumType;
  local_38 = CONCAT44(extraout_var,iVar1) | 0x1000000000000;
  TextureParameterDictionary::GetSpectrumTexture
            ((TextureParameterDictionary *)(local_98 + 2),(string *)parameters,
             (SpectrumHandle *)local_a8,(SpectrumType)&local_38,alloc_00);
  local_60[0].bits = (uintptr_t)local_50;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_60,"tex2","");
  local_40 = CONCAT44(extraout_var_00,iVar2) | 0x1000000000000;
  alloc_01.memoryResource._4_4_ = 0;
  alloc_01.memoryResource._0_4_ = spectrumType;
  TextureParameterDictionary::GetSpectrumTexture
            ((TextureParameterDictionary *)(local_b8 + 8),(string *)parameters,
             (SpectrumHandle *)local_60,(SpectrumType)&local_40,alloc_01);
  local_80 = local_70;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_80,"amount","");
  TextureParameterDictionary::GetFloatTexture
            ((TextureParameterDictionary *)local_b8,(string *)parameters,0.5,
             (memory_resource *)&local_80);
  iVar1 = (*(alloc.memoryResource)->_vptr_memory_resource[2])(alloc.memoryResource,0x18,8);
  pSVar3 = (SpectrumMixTexture *)CONCAT44(extraout_var_01,iVar1);
  (pSVar3->tex1).
  super_TaggedPointer<pbrt::SpectrumImageTexture,_pbrt::GPUSpectrumImageTexture,_pbrt::SpectrumMixTexture,_pbrt::SpectrumScaledTexture,_pbrt::SpectrumConstantTexture,_pbrt::SpectrumBilerpTexture,_pbrt::SpectrumCheckerboardTexture,_pbrt::MarbleTexture,_pbrt::SpectrumDotsTexture,_pbrt::SpectrumPtexTexture>
  .bits = (uintptr_t)local_88;
  (pSVar3->tex2).
  super_TaggedPointer<pbrt::SpectrumImageTexture,_pbrt::GPUSpectrumImageTexture,_pbrt::SpectrumMixTexture,_pbrt::SpectrumScaledTexture,_pbrt::SpectrumConstantTexture,_pbrt::SpectrumBilerpTexture,_pbrt::SpectrumCheckerboardTexture,_pbrt::MarbleTexture,_pbrt::SpectrumDotsTexture,_pbrt::SpectrumPtexTexture>
  .bits = local_b8._8_8_;
  (pSVar3->amount).
  super_TaggedPointer<pbrt::FloatImageTexture,_pbrt::GPUFloatImageTexture,_pbrt::FloatMixTexture,_pbrt::FloatScaledTexture,_pbrt::FloatConstantTexture,_pbrt::FloatBilerpTexture,_pbrt::FloatCheckerboardTexture,_pbrt::FloatDotsTexture,_pbrt::FBmTexture,_pbrt::FloatPtexTexture,_pbrt::WindyTexture,_pbrt::WrinkledTexture>
  .bits = local_b8._0_8_;
  if (local_80 != local_70) {
    operator_delete(local_80,local_70[0] + 1);
  }
  if ((_Base_ptr *)local_60[0].bits != local_50) {
    operator_delete((void *)local_60[0].bits,(ulong)((long)&local_50[0]->_M_color + 1));
  }
  if (local_a8[0] != local_98) {
    operator_delete(local_a8[0],local_98[0] + 1);
  }
  return pSVar3;
}

Assistant:

SpectrumMixTexture *SpectrumMixTexture::Create(
    const Transform &renderFromTexture, const TextureParameterDictionary &parameters,
    SpectrumType spectrumType, const FileLoc *loc, Allocator alloc) {
    SpectrumHandle zero = alloc.new_object<ConstantSpectrum>(0.);
    SpectrumHandle one = alloc.new_object<ConstantSpectrum>(1.);
    return alloc.new_object<SpectrumMixTexture>(
        parameters.GetSpectrumTexture("tex1", zero, spectrumType, alloc),
        parameters.GetSpectrumTexture("tex2", one, spectrumType, alloc),
        parameters.GetFloatTexture("amount", 0.5f, alloc));
}